

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O3

void thread_pool_destroy(thread_pool *pool)

{
  sem_t *__sem;
  int iVar1;
  ulong uVar2;
  void *local_30;
  void *return_value;
  
  if (pool == (thread_pool *)0x0) {
    return;
  }
  __sem = &pool->pool_mutex;
  iVar1 = sem_wait((sem_t *)__sem);
  if (iVar1 == 0) {
    pool->end = true;
    iVar1 = sem_post((sem_t *)__sem);
    if (iVar1 == 0) {
      if (pool->size != 0) {
        uVar2 = 0;
        do {
          iVar1 = sem_post((sem_t *)&pool->runnables_semaphore);
          if (iVar1 != 0) goto LAB_001015e5;
          uVar2 = uVar2 + 1;
        } while (uVar2 < pool->size);
        if (pool->size != 0) {
          uVar2 = 0;
          do {
            pthread_join(pool->threads[uVar2],&local_30);
            uVar2 = uVar2 + 1;
          } while (uVar2 < pool->size);
        }
      }
      pthread_attr_destroy((pthread_attr_t *)&pool->attr);
      sem_destroy((sem_t *)&pool->runnables_semaphore);
      sem_destroy((sem_t *)__sem);
      free(pool->runnables);
      free(pool->threads);
      return;
    }
  }
LAB_001015e5:
  exit(-4);
}

Assistant:

void thread_pool_destroy(struct thread_pool *pool) {
    /* Checks if the pointer is valid. */
    if(pool == NULL) {
        return;
    }
    if(sem_wait(&(pool->pool_mutex))){
        exit(semaphore_error);
    }

    /* Sets the flag for the threads. */
    pool->end = true;
    if(sem_post(&(pool->pool_mutex))) {
        exit(semaphore_error);
    }
    for(size_t i = 0; i < pool->size; i++) {
        if(sem_post(&(pool->runnables_semaphore))){
            exit(semaphore_error);
        }
    }

    void *return_value;
    for(size_t i = 0; i < pool->size; i++) {
        /* Waits, until all of the tasks are finished. */
        (pthread_join((pool->threads[i]), &return_value));
    }
    /* Destroys the pool */
    pthread_attr_destroy(&(pool->attr));
    sem_destroy(&(pool->runnables_semaphore));
    sem_destroy(&(pool->pool_mutex));
    free(pool->runnables);
    free(pool->threads);
}